

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

unique_ptr<cmFileListGeneratorBase,_std::default_delete<cmFileListGeneratorBase>_> __thiscall
cmFileListGeneratorProject::Clone(cmFileListGeneratorProject *this)

{
  cmFileListGeneratorProject *this_00;
  cmFileListGeneratorProject *in_RSI;
  cmFileListGeneratorProject *this_local;
  unique_ptr<cmFileListGeneratorBase,_std::default_delete<cmFileListGeneratorBase>_> *g;
  
  this_00 = (cmFileListGeneratorProject *)operator_new(0x20);
  cmFileListGeneratorProject(this_00,in_RSI);
  std::unique_ptr<cmFileListGeneratorBase,std::default_delete<cmFileListGeneratorBase>>::
  unique_ptr<std::default_delete<cmFileListGeneratorBase>,void>
            ((unique_ptr<cmFileListGeneratorBase,std::default_delete<cmFileListGeneratorBase>> *)
             this,(pointer)this_00);
  return (__uniq_ptr_data<cmFileListGeneratorBase,_std::default_delete<cmFileListGeneratorBase>,_true,_true>
          )(__uniq_ptr_data<cmFileListGeneratorBase,_std::default_delete<cmFileListGeneratorBase>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<cmFileListGeneratorBase> Clone() const override
  {
    std::unique_ptr<cmFileListGeneratorBase> g(
      new cmFileListGeneratorProject(*this));
    return g;
  }